

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layeredopacity.h
# Opt level: O2

void __thiscall LayeredOpacity::initialize(LayeredOpacity *this)

{
  RootWindow *pRVar1;
  undefined1 auVar2 [16];
  TransformNode *this_00;
  Node *child;
  Node *pNVar3;
  float *pfVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  rect2d geometry;
  rect2d geometry_00;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  OpacityNode *opacityNode;
  __shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  float local_58;
  float local_48;
  undefined1 local_38 [8];
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  anim;
  
  (*((((this->super_Example).m_window)->super_StandardSurface).super_Surface.m_impl)->
    _vptr_SurfaceBackendImpl[6])();
  local_58 = extraout_XMM0_Da / 3.0;
  local_48 = extraout_XMM0_Db / 3.0;
  this_00 = rengine::TransformNode::create();
  *(undefined8 *)&(this_00->super_Node).field_0x34 = 0x3f800000;
  *(undefined4 *)&this_00->field_0x3c = 0;
  *(float *)&this_00->field_0x40 = extraout_XMM0_Da * 0.5;
  *(undefined8 *)&this_00->field_0x44 = 0x3f80000000000000;
  *(undefined4 *)&this_00->field_0x4c = 0;
  *(float *)&this_00->field_0x50 = extraout_XMM0_Db * 0.5;
  *(undefined8 *)&this_00->field_0x54 = 0;
  *(undefined4 *)&this_00->field_0x5c = 0x3f800000;
  *(undefined8 *)&this_00->field_0x60 = 0;
  *(undefined8 *)&this_00->field_0x68 = 0;
  *(undefined8 *)&this_00->field_0x70 = 0x13f800000;
  child = &rengine::OpacityNode::create()->super_Node;
  rengine::Node::append(&this_00->super_Node,child);
  geometry.br.x = local_58 - local_58;
  geometry.br.y = local_48 - local_48;
  geometry.tl = (vec2)(CONCAT44(local_48,local_58) ^ 0x8000000080000000);
  color.z = 0.8;
  color.w = 1.0;
  color.x = 0.5;
  color.y = 0.5;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry,color);
  rengine::Node::append(child,pNVar3);
  geometry_00.tl.x = local_58 * -0.5;
  geometry_00.br.x = local_58 + geometry_00.tl.x;
  geometry_00.tl.y = local_48 * -0.5;
  geometry_00.br.y = local_48 + local_48 * -0.5;
  color_00.z = 0.8;
  color_00.w = 1.0;
  color_00.x = 0.5;
  color_00.y = 0.5;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry_00,color_00);
  rengine::Node::append(child,pNVar3);
  auVar2._4_4_ = local_48 + 0.0;
  auVar2._0_4_ = local_58 + 0.0;
  auVar2._8_8_ = 0;
  color_01.z = 0.8;
  color_01.w = 1.0;
  color_01.x = 0.5;
  color_01.y = 0.5;
  pNVar3 = (Node *)rengine::RectangleNode::create((rect2d)(auVar2 << 0x40),color_01);
  rengine::Node::append(child,pNVar3);
  std::
  make_shared<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,rengine::OpacityNode*&>
            ((OpacityNode **)local_38);
  rengine::AbstractAnimation::setDuration((AbstractAnimation *)local_38,3.0);
  rengine::AbstractAnimation::setDirection((AbstractAnimation *)local_38,Alternate);
  rengine::AbstractAnimation::setIterations((AbstractAnimation *)local_38,-1);
  pfVar4 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                          *)local_38,0.0);
  *pfVar4 = 1.0;
  pfVar4 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                          *)local_38,1.0);
  *pfVar4 = 0.0;
  pRVar1 = (this->super_Example).m_window;
  std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,void>
            (local_68,(__shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                       *)local_38);
  rengine::AnimationManager::start
            (&(pRVar1->super_StandardSurface).m_animationManager,
             (shared_ptr<rengine::AbstractAnimation> *)local_68,0.0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_animation,
             (__shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
              *)local_38);
  rengine::Node::append((Node *)this,&this_00->super_Node);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&anim);
  return;
}

Assistant:

void initialize() override {
        vec2 s = size();
        vec2 s3 = s / 3;

        // Root has origin in screen center
        TransformNode *root = TransformNode::create();
        root->setMatrix(mat4::translate2D(s.x * 0.5, s.y * 0.5));

        OpacityNode *opacityNode = OpacityNode::create();
        root->append(opacityNode);

        vec4 color(0.5, 0.5, 0.8, 1.0);

        *opacityNode << RectangleNode::create(rect2d::fromPosSize(-s3, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(-s3/2, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(vec2(), s3), color);

        auto anim = std::make_shared<Animation_OpacityNode_opacity>(opacityNode);
        anim->setDuration(3);
        anim->setDirection(AbstractAnimation::Alternate);
        anim->setIterations(-1);
        anim->newKeyFrame(0) = 1;
        anim->newKeyFrame(1) = 0;

        animationManager()->start(anim);

        m_animation = anim;

        append(root);
    }